

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O1

void glu::initCoreFunctions(Functions *dst,FunctionLoader *loader,ApiType apiType)

{
  InternalError *this;
  anon_struct_16_2_bb2ef977 *paVar1;
  ulong uVar2;
  ApiType local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_84.m_bits = apiType.m_bits;
  if (initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)::s_initFuncs ==
      '\0') {
    initCoreFunctions();
  }
  if (initCoreFunctions::s_initFuncs[0].apiType.m_bits == local_84.m_bits) {
    (*initCoreFunctions::s_initFuncs[0].initFunc)(dst,loader);
    return;
  }
  uVar2 = 0xffffffffffffffff;
  paVar1 = initCoreFunctions::s_initFuncs;
  do {
    paVar1 = paVar1 + 1;
    if (uVar2 == 0xc) goto LAB_00a385d3;
    uVar2 = uVar2 + 1;
  } while ((paVar1->apiType).m_bits != local_84.m_bits);
  (*paVar1->initFunc)(dst,loader);
  if (uVar2 < 0xd) {
    return;
  }
LAB_00a385d3:
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Don\'t know how to load functions for ","");
  de::toString<glu::ApiType>(&local_60,&local_84);
  std::operator+(&local_40,&local_80,&local_60);
  tcu::InternalError::InternalError(this,&local_40);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void initCoreFunctions (glw::Functions* dst, const glw::FunctionLoader* loader, ApiType apiType)
{
	static const struct
	{
		ApiType		apiType;
		void		(*initFunc)		(glw::Functions* gl, const glw::FunctionLoader* loader);
	} s_initFuncs[] =
	{
		{ ApiType::es(2,0),		glw::initES20		},
		{ ApiType::es(3,0),		glw::initES30		},
		{ ApiType::es(3,1),		glw::initES31		},
		{ ApiType::es(3,2),		glw::initES32		},
		{ ApiType::core(3,0),	glw::initGL30Core	},
		{ ApiType::core(3,1),	glw::initGL31Core	},
		{ ApiType::core(3,2),	glw::initGL32Core	},
		{ ApiType::core(3,3),	glw::initGL33Core	},
		{ ApiType::core(4,0),	glw::initGL40Core	},
		{ ApiType::core(4,1),	glw::initGL41Core	},
		{ ApiType::core(4,2),	glw::initGL42Core	},
		{ ApiType::core(4,3),	glw::initGL43Core	},
		{ ApiType::core(4,4),	glw::initGL44Core	},
		{ ApiType::core(4,5),	glw::initGL45Core	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_initFuncs); ndx++)
	{
		if (s_initFuncs[ndx].apiType == apiType)
		{
			s_initFuncs[ndx].initFunc(dst, loader);
			return;
		}
	}

	throw tcu::InternalError(std::string("Don't know how to load functions for ") + de::toString(apiType));
}